

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameOfLife.h
# Opt level: O2

void __thiscall
GameOfLife::GameOfLife(GameOfLife *this,vector<Point,_std::allocator<Point>_> *alivePoints)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  std::vector<Point,_std::allocator<Point>_>::vector(&this->aliveCells,alivePoints);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->aliveCharacter,"X",&local_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->deadCharacter,".",&local_1a);
  return;
}

Assistant:

explicit GameOfLife(std::vector<Point>& alivePoints) : aliveCells(alivePoints)
    {
    }